

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  type data;
  exception *exc;
  unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> file;
  fitting_result result;
  undefined1 local_90 [8];
  fitting_settings settings;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  settings.input_file.field_2._8_8_ = argv;
  fitting_settings::fitting_settings((fitting_settings *)local_90);
  bVar1 = get_fitting_settings_from_command_line
                    ((fitting_settings *)local_90,argc,(char **)settings.input_file.field_2._8_8_);
  if (bVar1) {
    if (local_90._0_4_ == exit) {
      argv_local._4_4_ = 0;
      bVar1 = true;
    }
    else if (local_90._0_4_ == test) {
      run_tests();
      argv_local._4_4_ = 0;
      bVar1 = true;
    }
    else if (local_90._0_4_ == preview_input) {
      std::__cxx11::string::string
                ((string *)
                 &result.transformations.
                  super__Vector_base<ltc_store_data,_std::allocator<ltc_store_data>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (string *)(settings.output_file.field_2._M_local_buf + 8));
      create_preview_for_file
                ((string *)
                 &result.transformations.
                  super__Vector_base<ltc_store_data,_std::allocator<ltc_store_data>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &result.transformations.
                  super__Vector_base<ltc_store_data,_std::allocator<ltc_store_data>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      argv_local._4_4_ = 0;
      bVar1 = true;
    }
    else {
      print_fitting_settings((fitting_settings *)local_90);
      build_lookup((fitting_result *)&file,(fitting_settings *)local_90);
      make_alf_file((fitting_result *)&exc);
      data = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator*
                       ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)&exc);
      alf::write_alf_file(data,(string *)((long)&settings.brdf_method.field_2 + 8));
      std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::~unique_ptr
                ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)&exc);
      fitting_result::~fitting_result((fitting_result *)&file);
      bVar1 = false;
    }
  }
  else {
    poVar2 = log_error();
    poVar2 = std::operator<<(poVar2,"Failed to set fitting settings, aborting...");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    bVar1 = true;
  }
  fitting_settings::~fitting_settings((fitting_settings *)local_90);
  if (!bVar1) {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char *argv[])
{
  try
  {
    fitting_settings settings;
    if (!get_fitting_settings_from_command_line(settings, argc, argv))
    {
      log_error() << "Failed to set fitting settings, aborting..." << std::endl;
      return EXIT_FAILURE;
    }

    if (settings.run_mode == run_mode::exit) {
      return EXIT_SUCCESS;
    }
    else if (settings.run_mode == run_mode::test) {
      run_tests();
      return EXIT_SUCCESS;
    } else if (settings.run_mode == run_mode::preview_input) {
      create_preview_for_file(settings.input_file);
      return EXIT_SUCCESS;
    }

    print_fitting_settings(settings);
    auto result = build_lookup(settings);

    auto file = make_alf_file(result);
    alf::write_alf_file(*file, settings.output_file);
  }
  catch (std::exception &exc)
  {
    log_error() << "Exception: " << exc.what() << std::endl;
    return EXIT_FAILURE;
  }
  catch (...)
  {
    log_error() << "Unknown exception has been thrown. Aborting." << std::endl;
    return EXIT_FAILURE;
  }

  return EXIT_SUCCESS;
}